

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_val_t FromWabtValue(Store *store,TypedValue *tv)

{
  Enum EVar1;
  uint uVar2;
  Ref RVar3;
  FILE *__stream;
  wasm_func_t *this;
  TypedValue *in_RDX;
  undefined7 uVar5;
  ulong uVar4;
  ulong uVar6;
  wasm_val_t wVar7;
  RefPtr<wabt::interp::Foreign> local_88;
  RefPtr<wabt::interp::Func> local_68;
  string local_48;
  
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_(&local_48,(interp *)tv,in_RDX);
  fprintf(__stream,"CAPI: [%s] %s\n","FromWabtValue",local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  EVar1 = (tv->type).enum_;
  uVar5 = (undefined7)((ulong)store >> 8);
  switch(EVar1) {
  case F64:
    this = (wasm_func_t *)(tv->value).field_0.i64_;
    uVar6 = (ulong)this & 0xffffffff00000000;
    uVar4 = CONCAT71(uVar5,3);
    break;
  case F32:
    uVar2 = (tv->value).field_0.i32_;
    uVar4 = CONCAT71(uVar5,2);
    goto LAB_0013046a;
  case I64:
    this = (wasm_func_t *)(tv->value).field_0.i64_;
    uVar6 = (ulong)this & 0xffffffff00000000;
    uVar4 = CONCAT71(uVar5,1);
    break;
  case I32:
    uVar2 = (tv->value).field_0.i32_;
    uVar4 = 0;
LAB_0013046a:
    this = (wasm_func_t *)(ulong)uVar2;
    uVar6 = 0;
    break;
  default:
    if (EVar1 == ExternRef) {
      RVar3.index = (tv->value).field_0.ref_.index;
      this = (wasm_func_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Foreign>::RefPtr(&local_88,store,RVar3);
      wasm_foreign_t::wasm_foreign_t((wasm_foreign_t *)this,&local_88);
      uVar6 = (ulong)this & 0xffffffff00000000;
      uVar4 = CONCAT71(uVar5,0x80);
      if (local_88.obj_ != (Foreign *)0x0) {
        wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
      }
    }
    else {
      if (EVar1 != FuncRef) {
        fprintf(_stderr,"CAPI: [%s] unexpected wabt type: %d\n","FromWabtValue");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                      ,0x1d6,"wasm_val_t FromWabtValue(Store &, const TypedValue &)");
      }
      RVar3.index = (tv->value).field_0.ref_.index;
      this = (wasm_func_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Func>::RefPtr(&local_68,store,RVar3);
      wasm_func_t::wasm_func_t(this,&local_68);
      uVar6 = (ulong)this & 0xffffffff00000000;
      uVar4 = CONCAT71(uVar5,0x81);
      if (local_68.obj_ != (Func *)0x0) {
        wabt::interp::Store::DeleteRoot(local_68.store_,local_68.root_index_);
      }
    }
  }
  wVar7.of.i64 = (ulong)this & 0xffffffff | uVar6;
  wVar7._0_8_ = uVar4 & 0xffffffff;
  return wVar7;
}

Assistant:

static wasm_val_t FromWabtValue(Store& store, const TypedValue& tv) {
  TRACE("%s", TypedValueToString(tv).c_str());
  wasm_val_t out_value;
  switch (tv.type) {
    case Type::I32:
      out_value.kind = WASM_I32;
      out_value.of.i32 = tv.value.Get<s32>();
      break;
    case Type::I64:
      out_value.kind = WASM_I64;
      out_value.of.i64 = tv.value.Get<s64>();
      break;
    case Type::F32:
      out_value.kind = WASM_F32;
      out_value.of.f32 = tv.value.Get<f32>();
      break;
    case Type::F64:
      out_value.kind = WASM_F64;
      out_value.of.f64 = tv.value.Get<f64>();
      break;
    case Type::FuncRef: {
      Ref ref = tv.value.Get<Ref>();
      out_value.kind = WASM_FUNCREF;
      out_value.of.ref = new wasm_func_t(store.UnsafeGet<Func>(ref));
      break;
    }
    case Type::ExternRef: {
      Ref ref = tv.value.Get<Ref>();
      out_value.kind = WASM_ANYREF;
      out_value.of.ref = new wasm_foreign_t(store.UnsafeGet<Foreign>(ref));
      break;
    }
    default:
      TRACE("unexpected wabt type: %d", static_cast<int>(tv.type));
      assert(false);
  }
  return out_value;
}